

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

unsigned_long_long kj::anon_unknown_39::parseUnsigned(StringPtr *s,unsigned_long_long max)

{
  bool bVar1;
  char cVar2;
  int *piVar3;
  char *pcVar4;
  char *s_00;
  int __base;
  Fault local_68;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  unsigned_long_long value;
  char *endPtr;
  Fault local_28;
  Fault f;
  unsigned_long_long max_local;
  StringPtr *s_local;
  
  f.exception = (Exception *)max;
  bVar1 = StringPtr::operator!=(s,(void *)0x0);
  if (bVar1) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    pcVar4 = StringPtr::begin(s);
    s_00 = StringPtr::cStr(s);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    f_1.exception = (Exception *)strtoull(pcVar4,(char **)&value,__base);
    pcVar4 = StringPtr::end(s);
    if ((char *)value == pcVar4) {
      piVar3 = __errno_location();
      if (*piVar3 == 0x22) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::StringPtr_const&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                   ,0x3c,FAILED,"errno != ERANGE","\"Value out-of-range\", s",
                   (char (*) [19])"Value out-of-range",s);
        s_local = (StringPtr *)0x0;
        _::Debug::Fault::~Fault(&f_3);
      }
      else if (f.exception < f_1.exception) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
                  (&f_4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                   ,0x3d,FAILED,"value <= max","\"Value out-of-range\", value, max",
                   (char (*) [19])"Value out-of-range",(unsigned_long_long *)&f_1,
                   (unsigned_long_long *)&f);
        s_local = (StringPtr *)0x0;
        _::Debug::Fault::~Fault(&f_4);
      }
      else {
        cVar2 = StringPtr::operator[](s,0);
        if (cVar2 == '-') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::StringPtr_const&>
                    (&local_68,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                     ,0x3f,FAILED,"s[0] != \'-\'","\"Value out-of-range\", s",
                     (char (*) [19])"Value out-of-range",s);
          s_local = (StringPtr *)0x0;
          _::Debug::Fault::~Fault(&local_68);
        }
        else {
          s_local = (StringPtr *)f_1.exception;
        }
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
                (&f_2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
                 ,0x3b,FAILED,"endPtr == s.end()","\"String does not contain valid number\", s",
                 (char (*) [37])"String does not contain valid number",s);
      s_local = (StringPtr *)0x0;
      _::Debug::Fault::~Fault(&f_2);
    }
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37],kj::StringPtr_const&>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string.c++"
               ,0x37,FAILED,"s != nullptr","\"String does not contain valid number\", s",
               (char (*) [37])"String does not contain valid number",s);
    s_local = (StringPtr *)0x0;
    _::Debug::Fault::~Fault(&local_28);
  }
  return (unsigned_long_long)s_local;
}

Assistant:

unsigned long long parseUnsigned(const StringPtr& s, unsigned long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value <= max, "Value out-of-range", value, max) { return 0; }
  //strtoull("-1") does not fail with ERANGE
  KJ_REQUIRE(s[0] != '-', "Value out-of-range", s) { return 0; }
  return value;
}